

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*>(_anonymous_namespace_ *this,char *args)

{
  size_t sVar1;
  Status SVar2;
  uintptr_t extraout_RAX;
  long *local_40;
  undefined8 local_38;
  long local_30 [2];
  
  if (args == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(args);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,args,args + sVar1);
  SVar2.rep_ = absl::lts_20240722::FailedPreconditionError(this,local_38,local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
    SVar2.rep_ = extraout_RAX;
  }
  return (Status)SVar2.rep_;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}